

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O1

int __thiscall cmCPackDebGenerator::createDeb(cmCPackDebGenerator *this)

{
  _Base_ptr *pp_Var1;
  cmCPackLog *pcVar2;
  undefined4 uVar3;
  uint uVar4;
  bool bVar5;
  cmCPackDebGenerator *pcVar6;
  size_type sVar7;
  undefined8 uVar8;
  size_t sVar9;
  bool bVar10;
  int iVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *__s;
  char *__s_00;
  char *__s_01;
  char *__s_02;
  char *__s_03;
  char *__s_04;
  char *__s_05;
  char *__s_06;
  char *__s_07;
  char *__s_08;
  char *__s_09;
  ostream *poVar15;
  size_t sVar16;
  long *plVar17;
  iterator iVar18;
  string *psVar19;
  FILE *pFVar20;
  size_t sVar21;
  size_t sVar22;
  _func_int **pp_Var23;
  long *plVar24;
  size_type *psVar25;
  _Alloc_hider _Var26;
  size_t off;
  pointer pbVar27;
  ulong uVar28;
  cmCPackDebGenerator *local_23c8;
  allocator local_23bd;
  int retval;
  char *local_23b8;
  FILE *local_23b0;
  string topLevelString;
  string output;
  string outputFileName;
  string cmd;
  string md5filename;
  string cmake_tar;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installDirs;
  string dirName;
  uint local_2270;
  size_t local_2260;
  __time_t local_2238;
  ios_base local_2220 [264];
  string compression_suffix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arFiles;
  string ctlfilename;
  string compression_modifier;
  string dbfilename;
  string debian_pkg_name;
  cmGeneratedFileStream out;
  
  dbfilename._M_dataplus._M_p = (pointer)&dbfilename.field_2;
  dbfilename._M_string_length = 0;
  dbfilename.field_2._M_local_buf[0] = '\0';
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&out,"GEN_WDIR","");
  local_23c8 = this;
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::append((char *)&dbfilename);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  std::__cxx11::string::append((char *)&dbfilename);
  cmGeneratedFileStream::cmGeneratedFileStream(&out,dbfilename._M_dataplus._M_p,false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"2.0",3);
  std::ios::widen((char)&out +
                  (char)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream[-3]);
  std::ostream::put((char)&out);
  std::ostream::flush();
  cmGeneratedFileStream::~cmGeneratedFileStream(&out);
  ctlfilename._M_dataplus._M_p = (pointer)&ctlfilename.field_2;
  ctlfilename._M_string_length = 0;
  ctlfilename.field_2._M_local_buf[0] = '\0';
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&out,"GEN_WDIR","");
  pcVar12 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  sVar7 = ctlfilename._M_string_length;
  strlen(pcVar12);
  std::__cxx11::string::_M_replace((ulong)&ctlfilename,0,(char *)sVar7,(ulong)pcVar12);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  std::__cxx11::string::append((char *)&ctlfilename);
  dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&dirName,"GEN_CPACK_DEBIAN_PACKAGE_NAME","");
  pcVar12 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,&dirName);
  std::__cxx11::string::string((string *)&out,pcVar12,(allocator *)&installDirs);
  cmsys::SystemTools::LowerCase(&debian_pkg_name,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dirName._M_dataplus._M_p != &dirName.field_2) {
    operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_VERSION","");
  pcVar12 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_SECTION","");
  pcVar13 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_PRIORITY","");
  pcVar14 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE","");
  __s = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER","");
  __s_00 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION","");
  __s_01 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_DEPENDS","");
  __s_02 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS","");
  __s_03 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS","");
  __s_04 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE","");
  local_23b0 = (FILE *)cmCPackGenerator::GetOption
                                 (&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS","");
  local_23b8 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_ENHANCES","");
  __s_05 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_BREAKS","");
  __s_06 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS","");
  __s_07 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_PROVIDES","");
  __s_08 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_REPLACES","");
  __s_09 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  cmGeneratedFileStream::cmGeneratedFileStream(&out,ctlfilename._M_dataplus._M_p,false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Package: ",9);
  poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&out,debian_pkg_name._M_dataplus._M_p,
                       debian_pkg_name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Version: ",9);
  if (pcVar12 == (char *)0x0) {
    std::ios::clear((int)&local_23c8 +
                    (int)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3] + 0x390);
  }
  else {
    sVar16 = strlen(pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,pcVar12,sVar16);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Section: ",9);
  if (pcVar13 == (char *)0x0) {
    std::ios::clear((int)&local_23c8 +
                    (int)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3] + 0x390);
  }
  else {
    sVar16 = strlen(pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,pcVar13,sVar16);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Priority: ",10);
  if (pcVar14 == (char *)0x0) {
    std::ios::clear((int)&local_23c8 +
                    (int)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3] + 0x390);
  }
  else {
    sVar16 = strlen(pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,pcVar14,sVar16);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Architecture: ",0xe);
  if (__s == (char *)0x0) {
    std::ios::clear((int)&local_23c8 +
                    (int)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3] + 0x390);
  }
  else {
    sVar16 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s,sVar16);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  if ((__s_02 != (char *)0x0) && (*__s_02 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Depends: ",9);
    sVar16 = strlen(__s_02);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_02,sVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((__s_03 != (char *)0x0) && (*__s_03 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Recommends: ",0xc);
    sVar16 = strlen(__s_03);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_03,sVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((__s_04 != (char *)0x0) && (*__s_04 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Suggests: ",10);
    sVar16 = strlen(__s_04);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_04,sVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((local_23b0 != (FILE *)0x0) && ((char)local_23b0->_flags != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Homepage: ",10);
    pFVar20 = local_23b0;
    sVar16 = strlen((char *)local_23b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,(char *)pFVar20,sVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((local_23b8 != (char *)0x0) && (*local_23b8 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Pre-Depends: ",0xd);
    pcVar12 = local_23b8;
    sVar16 = strlen(local_23b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,pcVar12,sVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((__s_05 != (char *)0x0) && (*__s_05 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Enhances: ",10);
    sVar16 = strlen(__s_05);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_05,sVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((__s_06 != (char *)0x0) && (*__s_06 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Breaks: ",8);
    sVar16 = strlen(__s_06);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_06,sVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((__s_07 != (char *)0x0) && (*__s_07 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Conflicts: ",0xb);
    sVar16 = strlen(__s_07);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_07,sVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((__s_08 != (char *)0x0) && (*__s_08 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Provides: ",10);
    sVar16 = strlen(__s_08);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_08,sVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((__s_09 != (char *)0x0) && (*__s_09 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Replaces: ",10);
    sVar16 = strlen(__s_09);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_09,sVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  pp_Var1 = &installDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  installDirs._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&installDirs,"CPACK_TEMPORARY_DIRECTORY","");
  pcVar12 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&installDirs);
  std::__cxx11::string::string((string *)&dirName,pcVar12,(allocator *)&cmd);
  if ((_Base_ptr *)installDirs._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)installDirs._M_t._M_impl._0_8_,
                    (ulong)((long)&(installDirs._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  std::__cxx11::string::push_back((char)&dirName);
  pbVar27 = (local_23c8->packageFiles).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar27 !=
      (local_23c8->packageFiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      cmsys::SystemTools::FileLength(pbVar27);
      pbVar27 = pbVar27 + 1;
    } while (pbVar27 !=
             (local_23c8->packageFiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dirName._M_dataplus._M_p != &dirName.field_2) {
    operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Installed-Size: ",0x10);
  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Maintainer: ",0xc);
  if (__s_00 == (char *)0x0) {
    std::ios::clear((int)&local_23c8 +
                    (int)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3] + 0x390);
  }
  else {
    sVar16 = strlen(__s_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_00,sVar16);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Description: ",0xd);
  if (__s_01 == (char *)0x0) {
    std::ios::clear((int)&local_23c8 +
                    (int)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3] + 0x390);
  }
  else {
    sVar16 = strlen(__s_01);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_01,sVar16);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  std::ios::widen((char)&out +
                  (char)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream[-3]);
  std::ostream::put((char)&out);
  std::ostream::flush();
  cmGeneratedFileStream::~cmGeneratedFileStream(&out);
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_FAKEROOT_EXECUTABLE","");
  pcVar12 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::string((string *)&cmd,pcVar12,(allocator *)&dirName);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_COMPRESSION_TYPE","");
  pcVar12 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  pcVar13 = "gzip";
  if (pcVar12 != (char *)0x0) {
    pcVar13 = pcVar12;
  }
  cmake_tar._M_dataplus._M_p = (pointer)&cmake_tar.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmake_tar," ","");
  compression_modifier._M_dataplus._M_p = (pointer)&compression_modifier.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&compression_modifier,"a","");
  compression_suffix._M_dataplus._M_p = (pointer)&compression_suffix.field_2;
  compression_suffix._M_string_length = 0;
  compression_suffix.field_2._M_local_buf[0] = '\0';
  iVar11 = strcmp(pcVar13,"lzma");
  if (iVar11 == 0) {
    pcVar12 = ".lzma";
  }
  else {
    iVar11 = strcmp(pcVar13,"xz");
    if (iVar11 != 0) {
      iVar11 = strcmp(pcVar13,"bzip2");
      if (iVar11 == 0) {
        std::__cxx11::string::_M_replace((ulong)&compression_suffix,0,(char *)0x0,0x4ed2db);
        std::__cxx11::string::_M_replace
                  ((ulong)&compression_modifier,0,(char *)compression_modifier._M_string_length,
                   0x4fd4f0);
        psVar19 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        std::operator+(&dirName,"\"",psVar19);
        plVar17 = (long *)std::__cxx11::string::append((char *)&dirName);
        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)
             &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
        pp_Var23 = (_func_int **)(plVar17 + 2);
        if ((_func_int **)*plVar17 == pp_Var23) {
          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var23;
          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar17[3];
        }
        else {
          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var23;
          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
               = (_func_int **)*plVar17;
        }
        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar17[1];
        *plVar17 = (long)pp_Var23;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)&cmake_tar,
                   (ulong)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream);
      }
      else {
        iVar11 = strcmp(pcVar13,"gzip");
        if (iVar11 == 0) {
          std::__cxx11::string::_M_replace((ulong)&compression_suffix,0,(char *)0x0,0x4f3e6a);
          std::__cxx11::string::_M_replace
                    ((ulong)&compression_modifier,0,(char *)compression_modifier._M_string_length,
                     0x4ed37b);
          psVar19 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
          std::operator+(&dirName,"\"",psVar19);
          plVar17 = (long *)std::__cxx11::string::append((char *)&dirName);
          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
               = (_func_int **)
                 &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
          pp_Var23 = (_func_int **)(plVar17 + 2);
          if ((_func_int **)*plVar17 == pp_Var23) {
            out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var23
            ;
            out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
                 plVar17[3];
          }
          else {
            out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var23
            ;
            out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            _vptr_basic_ostream = (_func_int **)*plVar17;
          }
          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar17[1];
          *plVar17 = (long)pp_Var23;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)&cmake_tar,
                     (ulong)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream);
        }
        else {
          iVar11 = strcmp(pcVar13,"none");
          if (iVar11 != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&out,"Error unrecognized compression type: ",0x25);
            sVar16 = strlen(pcVar13);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,pcVar13,sVar16);
            std::ios::widen((char)&out +
                            (char)out.super_ofstream.
                                  super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream[-3]);
            std::ostream::put((char)&out);
            std::ostream::flush();
            pcVar2 = (local_23c8->super_cmCPackGenerator).Logger;
            std::__cxx11::stringbuf::str();
            _Var26 = dirName._M_dataplus;
            sVar16 = strlen(dirName._M_dataplus._M_p);
            cmCPackLog::Log(pcVar2,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                            ,0x1b1,_Var26._M_p,sVar16);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)dirName._M_dataplus._M_p != &dirName.field_2) {
              operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        field_0x70);
            goto LAB_00254593;
          }
          std::__cxx11::string::_M_replace((ulong)&compression_suffix,0,(char *)0x0,0x53c2a5);
          std::__cxx11::string::_M_replace
                    ((ulong)&compression_modifier,0,(char *)compression_modifier._M_string_length,
                     0x53c2a5);
          psVar19 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
          std::operator+(&dirName,"\"",psVar19);
          plVar17 = (long *)std::__cxx11::string::append((char *)&dirName);
          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
               = (_func_int **)
                 &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
          pp_Var23 = (_func_int **)(plVar17 + 2);
          if ((_func_int **)*plVar17 == pp_Var23) {
            out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var23
            ;
            out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
                 plVar17[3];
          }
          else {
            out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var23
            ;
            out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            _vptr_basic_ostream = (_func_int **)*plVar17;
          }
          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar17[1];
          *plVar17 = (long)pp_Var23;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)&cmake_tar,
                     (ulong)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream);
        }
      }
      if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
          != (_func_int **)
             &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dirName._M_dataplus._M_p != &dirName.field_2) {
        operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00254593;
    }
    pcVar12 = ".xz";
  }
  std::__cxx11::string::_M_replace((ulong)&compression_suffix,0,(char *)0x0,(ulong)pcVar12);
LAB_00254593:
  output._M_dataplus._M_p = (pointer)&output.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&output,cmake_tar._M_dataplus._M_p,
             cmake_tar._M_dataplus._M_p + cmake_tar._M_string_length);
  std::__cxx11::string::append((char *)&output);
  plVar17 = (long *)std::__cxx11::string::_M_append
                              ((char *)&output,(ulong)compression_modifier._M_dataplus._M_p);
  plVar24 = plVar17 + 2;
  if ((long *)*plVar17 == plVar24) {
    installDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar24;
    installDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar17[3];
    installDirs._M_t._M_impl._0_8_ = pp_Var1;
  }
  else {
    installDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar24;
    installDirs._M_t._M_impl._0_8_ = (long *)*plVar17;
  }
  installDirs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar17[1];
  *plVar17 = (long)plVar24;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::append((char *)&installDirs);
  dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
  psVar25 = (size_type *)(plVar17 + 2);
  if ((size_type *)*plVar17 == psVar25) {
    dirName.field_2._M_allocated_capacity = *psVar25;
    dirName.field_2._8_8_ = plVar17[3];
  }
  else {
    dirName.field_2._M_allocated_capacity = *psVar25;
    dirName._M_dataplus._M_p = (pointer)*plVar17;
  }
  dirName._M_string_length = plVar17[1];
  *plVar17 = (long)psVar25;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::_M_append
                              ((char *)&dirName,(ulong)compression_suffix._M_dataplus._M_p);
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  pp_Var23 = (_func_int **)(plVar17 + 2);
  if ((_func_int **)*plVar17 == pp_Var23) {
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var23;
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar17[3];
  }
  else {
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var23;
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)*plVar17;
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar17[1];
  *plVar17 = (long)pp_Var23;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  std::__cxx11::string::_M_append
            ((char *)&cmd,
             (ulong)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dirName._M_dataplus._M_p != &dirName.field_2) {
    operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
  }
  if ((_Base_ptr *)installDirs._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)installDirs._M_t._M_impl._0_8_,
                    (ulong)((long)&(installDirs._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)output._M_dataplus._M_p != &output.field_2) {
    operator_delete(output._M_dataplus._M_p,
                    CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                             output.field_2._M_local_buf[0]) + 1);
  }
  dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dirName,"GEN_WDIR","");
  pcVar12 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,&dirName);
  std::__cxx11::string::string((string *)&out,pcVar12,(allocator *)&installDirs);
  uVar8 = out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_;
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dirName._M_dataplus._M_p != &dirName.field_2) {
    operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"WDIR: \"",7);
  dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dirName,"GEN_WDIR","");
  pcVar12 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,&dirName);
  if (pcVar12 == (char *)0x0) {
    std::ios::clear((int)&local_23c8 +
                    (int)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3] + 0x390);
  }
  else {
    sVar16 = strlen(pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,pcVar12,sVar16);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\", length = ",0xc);
  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&out);
  std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
  std::ostream::put((char)poVar15);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dirName._M_dataplus._M_p != &dirName.field_2) {
    operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (local_23c8->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  _Var26 = dirName._M_dataplus;
  sVar16 = strlen(dirName._M_dataplus._M_p);
  cmCPackLog::Log(pcVar2,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                  ,0x1be,_Var26._M_p,sVar16);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dirName._M_dataplus._M_p != &dirName.field_2) {
    operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  std::ios_base::~ios_base
            ((ios_base *)
             &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  installDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &installDirs._M_t._M_impl.super__Rb_tree_header._M_header;
  installDirs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       installDirs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  installDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  installDirs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pbVar27 = (local_23c8->packageFiles).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  installDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       installDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pbVar27 !=
      (local_23c8->packageFiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_23b0 = (FILE *)(uVar8 + 1);
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"FILEIT: \"",9);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&out,(pbVar27->_M_dataplus)._M_p,pbVar27->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\"",1);
      std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
      pcVar2 = (local_23c8->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      _Var26 = dirName._M_dataplus;
      sVar16 = strlen(dirName._M_dataplus._M_p);
      cmCPackLog::Log(pcVar2,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x1c5,_Var26._M_p,sVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dirName._M_dataplus._M_p != &dirName.field_2) {
        operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
      std::ios_base::~ios_base
                ((ios_base *)
                 &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
      std::__cxx11::string::find((char)pbVar27,0x2f);
      std::__cxx11::string::substr((ulong)&dirName,(ulong)pbVar27);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"RELATIVEDIR: \"",0xe);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&out,dirName._M_dataplus._M_p,dirName._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\"",1);
      std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
      pcVar2 = (local_23c8->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      _Var26 = output._M_dataplus;
      sVar16 = strlen(output._M_dataplus._M_p);
      cmCPackLog::Log(pcVar2,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x1ca,_Var26._M_p,sVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)output._M_dataplus._M_p != &output.field_2) {
        operator_delete(output._M_dataplus._M_p,
                        CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                                 output.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
      std::ios_base::~ios_base
                ((ios_base *)
                 &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
      iVar18 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&installDirs._M_t,&dirName);
      if ((_Rb_tree_header *)iVar18._M_node == &installDirs._M_t._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&installDirs,&dirName);
        std::__cxx11::string::append((char *)&cmd);
        std::__cxx11::string::_M_append((char *)&cmd,(ulong)dirName._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dirName._M_dataplus._M_p != &dirName.field_2) {
        operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
      }
      pbVar27 = pbVar27 + 1;
    } while (pbVar27 !=
             (local_23c8->packageFiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  _Var26._M_p = cmd._M_dataplus._M_p;
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  retval = -1;
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&out,"GEN_WDIR","");
  pcVar6 = local_23c8;
  pcVar12 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
  bVar10 = cmSystemTools::RunSingleCommand
                     (_Var26._M_p,&output,&output,&retval,pcVar12,
                      (pcVar6->super_cmCPackGenerator).GeneratorVerbose,0.0);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  if (bVar10 && retval == 0) {
    md5filename._M_dataplus._M_p = (pointer)&md5filename.field_2;
    md5filename._M_string_length = 0;
    md5filename.field_2._M_local_buf[0] = '\0';
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)
         &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&out,"GEN_WDIR","");
    pcVar12 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
    sVar7 = md5filename._M_string_length;
    strlen(pcVar12);
    std::__cxx11::string::_M_replace((ulong)&md5filename,0,(char *)sVar7,(ulong)pcVar12);
    if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
        (_func_int **)
        &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ +
                      1);
    }
    std::__cxx11::string::append((char *)&md5filename);
    cmGeneratedFileStream::cmGeneratedFileStream(&out,md5filename._M_dataplus._M_p,false);
    dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&dirName,"CPACK_TEMPORARY_DIRECTORY","");
    pcVar12 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,&dirName);
    std::__cxx11::string::string((string *)&topLevelString,pcVar12,(allocator *)&outputFileName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dirName._M_dataplus._M_p != &dirName.field_2) {
      operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::push_back((char)&topLevelString);
    pbVar27 = (local_23c8->packageFiles).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar27 !=
        (local_23c8->packageFiles).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__cxx11::string::_M_replace((ulong)&cmd,0,(char *)cmd._M_string_length,0x52b5bc);
        psVar19 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        std::__cxx11::string::_M_append((char *)&cmd,(ulong)(psVar19->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&cmd);
        std::__cxx11::string::_M_append((char *)&cmd,(ulong)(pbVar27->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&cmd);
        bVar10 = cmSystemTools::RunSingleCommand
                           (cmd._M_dataplus._M_p,&output,&output,&retval,
                            (local_23c8->super_cmCPackGenerator).toplevel._M_dataplus._M_p,
                            (local_23c8->super_cmCPackGenerator).GeneratorVerbose,0.0);
        if (!bVar10 || retval != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dirName,"Problem running cmake -E md5sum ",0x20);
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&dirName,cmd._M_dataplus._M_p,cmd._M_string_length);
          std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
          std::ostream::put((char)poVar15);
          std::ostream::flush();
          pcVar2 = (local_23c8->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          _Var26 = outputFileName._M_dataplus;
          sVar16 = strlen(outputFileName._M_dataplus._M_p);
          cmCPackLog::Log(pcVar2,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                          ,0x201,_Var26._M_p,sVar16);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)outputFileName._M_dataplus._M_p != &outputFileName.field_2) {
            operator_delete(outputFileName._M_dataplus._M_p,
                            outputFileName.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
          std::ios_base::~ios_base(local_2220);
        }
        cmsys::SystemTools::ReplaceString(&output,topLevelString._M_dataplus._M_p,"");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&out,output._M_dataplus._M_p,output._M_string_length);
        pbVar27 = pbVar27 + 1;
      } while (pbVar27 !=
               (local_23c8->packageFiles).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)topLevelString._M_dataplus._M_p != &topLevelString.field_2) {
      operator_delete(topLevelString._M_dataplus._M_p,
                      topLevelString.field_2._M_allocated_capacity + 1);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&out);
    cmsys::SystemTools::SetPermissions(md5filename._M_dataplus._M_p,0x1a4);
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)
         &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&out,"GEN_CPACK_DEBIAN_FAKEROOT_EXECUTABLE","");
    pcVar12 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
    sVar7 = cmd._M_string_length;
    strlen(pcVar12);
    std::__cxx11::string::_M_replace((ulong)&cmd,0,(char *)sVar7,(ulong)pcVar12);
    if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
        (_func_int **)
        &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ +
                      1);
    }
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)
         &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&out,cmake_tar._M_dataplus._M_p,
               cmake_tar._M_dataplus._M_p + cmake_tar._M_string_length);
    std::__cxx11::string::append((char *)&out);
    std::__cxx11::string::_M_append
              ((char *)&cmd,
               (ulong)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream);
    if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
        (_func_int **)
        &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ +
                      1);
    }
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)
         &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA","");
    pcVar12 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
    if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
        (_func_int **)
        &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ +
                      1);
    }
    if (pcVar12 != (char *)0x0) {
      outputFileName._M_dataplus._M_p = (pointer)0x0;
      outputFileName._M_string_length = 0;
      outputFileName.field_2._M_allocated_capacity = 0;
      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      sVar16 = strlen(pcVar12);
      std::__cxx11::string::_M_construct<char_const*>((string *)&out,pcVar12,pcVar12 + sVar16);
      cmSystemTools::ExpandListArgument
                ((string *)&out,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&outputFileName,false);
      if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
          != (_func_int **)
             &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                        + 1);
      }
      if (outputFileName._M_dataplus._M_p != (pointer)outputFileName._M_string_length) {
        _Var26._M_p = outputFileName._M_dataplus._M_p;
        do {
          cmsys::SystemTools::GetFilenameName((string *)&out,(string *)_Var26._M_p);
          topLevelString._M_dataplus._M_p = (pointer)&topLevelString.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&topLevelString,"GEN_WDIR","");
          pcVar12 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,&topLevelString)
          ;
          std::__cxx11::string::string((string *)&dirName,pcVar12,(allocator *)&arFiles);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)topLevelString._M_dataplus._M_p != &topLevelString.field_2) {
            operator_delete(topLevelString._M_dataplus._M_p,
                            topLevelString.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&dirName);
          std::__cxx11::string::_M_append
                    ((char *)&dirName,
                     (ulong)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream);
          bVar10 = cmsys::SystemTools::CopyFileIfDifferent((string *)_Var26._M_p,&dirName);
          if (bVar10) {
            std::__cxx11::string::append((char *)&cmd);
            std::__cxx11::string::_M_append
                      ((char *)&cmd,
                       (ulong)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dirName._M_dataplus._M_p != &dirName.field_2) {
            operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
          }
          if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream !=
              (_func_int **)
              &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
            operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream,
                            out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                            _16_8_ + 1);
          }
          _Var26._M_p = _Var26._M_p + 0x20;
        } while (_Var26._M_p != (pointer)outputFileName._M_string_length);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&outputFileName);
    }
    _Var26._M_p = cmd._M_dataplus._M_p;
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)
         &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&out,"GEN_WDIR","");
    pcVar6 = local_23c8;
    pcVar12 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
    bVar10 = cmSystemTools::RunSingleCommand
                       (_Var26._M_p,&output,&output,&retval,pcVar12,
                        (pcVar6->super_cmCPackGenerator).GeneratorVerbose,0.0);
    if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
        (_func_int **)
        &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ +
                      1);
    }
    if (bVar10 && retval == 0) {
      arFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      arFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      arFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&out,"GEN_WDIR","");
      pcVar12 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
      std::__cxx11::string::string((string *)&topLevelString,pcVar12,(allocator *)&dirName);
      if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
          != (_func_int **)
             &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                        + 1);
      }
      std::__cxx11::string::append((char *)&topLevelString);
      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&out,topLevelString._M_dataplus._M_p,
                 topLevelString._M_dataplus._M_p + topLevelString._M_string_length);
      std::__cxx11::string::append((char *)&out);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arFiles,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
      if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
          != (_func_int **)
             &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                        + 1);
      }
      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&out,topLevelString._M_dataplus._M_p,
                 topLevelString._M_dataplus._M_p + topLevelString._M_string_length);
      std::__cxx11::string::append((char *)&out);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arFiles,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
      if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
          != (_func_int **)
             &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                        + 1);
      }
      dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&dirName,topLevelString._M_dataplus._M_p,
                 topLevelString._M_dataplus._M_p + topLevelString._M_string_length);
      std::__cxx11::string::append((char *)&dirName);
      plVar17 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&dirName,(ulong)compression_suffix._M_dataplus._M_p);
      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      pp_Var23 = (_func_int **)(plVar17 + 2);
      if ((_func_int **)*plVar17 == pp_Var23) {
        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var23;
        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar17[3];
      }
      else {
        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var23;
        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)*plVar17;
      }
      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar17[1];
      *plVar17 = (long)pp_Var23;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arFiles,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
      if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
          != (_func_int **)
             &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dirName._M_dataplus._M_p != &dirName.field_2) {
        operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
      }
      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&out,"CPACK_TOPLEVEL_DIRECTORY","");
      pcVar12 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
      std::__cxx11::string::string((string *)&outputFileName,pcVar12,(allocator *)&dirName);
      if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
          != (_func_int **)
             &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                        + 1);
      }
      std::__cxx11::string::append((char *)&outputFileName);
      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&out,"CPACK_OUTPUT_FILE_NAME","");
      cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
      std::__cxx11::string::append((char *)&outputFileName);
      if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
          != (_func_int **)
             &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                        + 1);
      }
      std::__cxx11::string::string
                ((string *)&out,outputFileName._M_dataplus._M_p,(allocator *)&dirName);
      pFVar20 = (FILE *)cmsys::SystemTools::Fopen((string *)&out,"wb+");
      if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
          != (_func_int **)
             &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                        + 1);
      }
      if (pFVar20 == (FILE *)0x0) {
        iVar11 = -4;
      }
      else {
        fwrite("!<arch>\n",8,1,pFVar20);
        pcVar12 = (char *)0x0;
        iVar11 = fseek(pFVar20,0,2);
        if (iVar11 == -1) {
          iVar11 = -3;
        }
        else {
          local_23b0 = pFVar20;
          if (arFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              arFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pcVar12 = (char *)0x0;
            pbVar27 = arFiles.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              pcVar13 = (pbVar27->_M_dataplus)._M_p;
              std::__cxx11::string::string((string *)&out,pcVar13,&local_23bd);
              pFVar20 = (FILE *)cmsys::SystemTools::Fopen((string *)&out,"rb");
              if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                  _vptr_basic_ostream !=
                  (_func_int **)
                  &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(out.super_ofstream.
                                super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                out.super_ofstream.
                                super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if (pFVar20 == (FILE *)0x0) {
                pcVar12 = (char *)0xffffffff;
                bVar10 = false;
              }
              else {
                local_23b8 = pcVar12;
                pcVar14 = strrchr(pcVar13,0x2f);
                pcVar12 = pcVar14 + 1;
                if (pcVar14 == (char *)0x0) {
                  pcVar12 = pcVar13;
                }
                stat64(pcVar13,(stat64 *)&dirName);
                sVar16 = strlen(pcVar12);
                uVar3 = dirName.field_2._12_4_;
                if (0xfffe < (uint)dirName.field_2._12_4_) {
                  uVar3 = 0xffff;
                }
                uVar4 = local_2270;
                if (0xfffe < local_2270) {
                  uVar4 = 0xffff;
                }
                if ((sVar16 < 0x11) && (pcVar13 = strchr(pcVar12,0x20), pcVar13 == (char *)0x0)) {
                  sprintf(ar_hb,"%-16.16s%-12ld%-6u%-6u%-8o%-10lld%2s",pcVar12,local_2238,
                          (ulong)(uint)uVar3,(ulong)uVar4,dirName.field_2._8_8_ & 0xffffffff,
                          local_2260,"`\n");
                  sVar16 = 0;
                }
                else {
                  sprintf(ar_hb,"%s%-13d%-12ld%-6u%-6u%-8o%-10lld%2s","#1/",sVar16 & 0xffffffff,
                          local_2238,(ulong)(uint)uVar3,(ulong)uVar4,
                          dirName.field_2._8_8_ & 0xffffffff,local_2260 + sVar16,"`\n");
                }
                sVar21 = fwrite(ar_hb,1,0x3c,local_23b0);
                if (sVar21 == 0x3c) {
                  sVar9 = ar_already_written;
                  if ((sVar16 == 0) ||
                     (sVar21 = fwrite(pcVar12,1,sVar16,local_23b0), sVar9 = sVar16, sVar21 == sVar16
                     )) {
                    ar_already_written = sVar9;
                    bVar5 = true;
                    sVar16 = local_2260;
                    if (local_2260 != 0) {
                      do {
                        sVar21 = 0x2000;
                        if ((long)sVar16 < 0x2000) {
                          sVar21 = sVar16;
                        }
                        sVar21 = fread(&out,1,sVar21,pFVar20);
                        if (sVar21 == 0) goto LAB_00256205;
                        sVar16 = sVar16 - sVar21;
                        uVar28 = 0;
                        do {
                          sVar22 = fwrite((void *)((long)&out.super_ofstream.
                                                                                                                    
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream + uVar28),1,sVar21,local_23b0
                                         );
                          if (sVar22 < sVar21) goto LAB_00256205;
                          sVar21 = sVar21 - uVar28;
                          uVar28 = uVar28 + sVar22;
                        } while (uVar28 < sVar21);
                      } while (sVar16 != 0);
                      if ((((int)local_2260 + (int)ar_already_written & 1U) != 0) &&
                         (sVar16 = fwrite(&copy_ar(CF*,long)::pad,1,1,local_23b0), sVar16 != 1)) {
LAB_00256205:
                        bVar5 = false;
                      }
                    }
                    ar_already_written = 0;
                  }
                  else {
                    bVar5 = false;
                  }
                }
                else {
                  bVar5 = false;
                }
                pcVar12 = local_23b8;
                fclose(pFVar20);
                bVar10 = (bool)(bVar5 ^ 1);
                pcVar12 = (char *)((ulong)pcVar12 & 0xffffffff);
                if (!bVar5) {
                  pcVar12 = (char *)0xfffffffe;
                }
              }
            } while ((!bVar10) &&
                    (pbVar27 = pbVar27 + 1,
                    pbVar27 !=
                    arFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish));
          }
          iVar11 = (int)pcVar12;
          pFVar20 = local_23b0;
        }
        fclose(pFVar20);
      }
      if (iVar11 == 0) {
        iVar11 = 1;
      }
      else {
        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)
             &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&out,"CPACK_TEMPORARY_PACKAGE_FILE_NAME","");
        pcVar12 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
        std::__cxx11::string::string((string *)&dirName,pcVar12,&local_23bd);
        if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            _vptr_basic_ostream !=
            (_func_int **)
            &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
          operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream,
                          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _16_8_ + 1);
        }
        std::__cxx11::string::append((char *)&dirName);
        cmGeneratedFileStream::cmGeneratedFileStream(&out,dirName._M_dataplus._M_p,false);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&out,"# Problem creating archive using: ",0x22);
        plVar17 = (long *)std::ostream::operator<<(&out,iVar11);
        std::ios::widen((char)*(undefined8 *)(*plVar17 + -0x18) + (char)plVar17);
        std::ostream::put((char)plVar17);
        std::ostream::flush();
        cmGeneratedFileStream::~cmGeneratedFileStream(&out);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dirName._M_dataplus._M_p != &dirName.field_2) {
          operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
        }
        iVar11 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outputFileName._M_dataplus._M_p != &outputFileName.field_2) {
        operator_delete(outputFileName._M_dataplus._M_p,
                        outputFileName.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)topLevelString._M_dataplus._M_p != &topLevelString.field_2) {
        operator_delete(topLevelString._M_dataplus._M_p,
                        topLevelString.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&arFiles);
    }
    else {
      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&out,"CPACK_TOPLEVEL_DIRECTORY","");
      pcVar12 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
      std::__cxx11::string::string((string *)&topLevelString,pcVar12,(allocator *)&dirName);
      if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
          != (_func_int **)
             &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                        + 1);
      }
      std::__cxx11::string::append((char *)&topLevelString);
      cmGeneratedFileStream::cmGeneratedFileStream(&out,topLevelString._M_dataplus._M_p,false);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"# Run command: ",0xf);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&out,cmd._M_dataplus._M_p,cmd._M_string_length);
      std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
      std::ostream::put((char)poVar15);
      poVar15 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"# Working directory: ",0x15);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(local_23c8->super_cmCPackGenerator).toplevel._M_dataplus._M_p,
                           (local_23c8->super_cmCPackGenerator).toplevel._M_string_length);
      std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
      std::ostream::put((char)poVar15);
      poVar15 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"# Output:",9);
      std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
      std::ostream::put((char)poVar15);
      poVar15 = (ostream *)std::ostream::flush();
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,output._M_dataplus._M_p,output._M_string_length);
      std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&dirName,"Problem running tar command: ",0x1d);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&dirName,cmd._M_dataplus._M_p,cmd._M_string_length);
      std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
      std::ostream::put((char)poVar15);
      poVar15 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"Please check ",0xd);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,topLevelString._M_dataplus._M_p,topLevelString._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," for errors",0xb);
      std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
      pcVar2 = (local_23c8->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      _Var26 = outputFileName._M_dataplus;
      sVar16 = strlen(outputFileName._M_dataplus._M_p);
      cmCPackLog::Log(pcVar2,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x23b,_Var26._M_p,sVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outputFileName._M_dataplus._M_p != &outputFileName.field_2) {
        operator_delete(outputFileName._M_dataplus._M_p,
                        outputFileName.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
      std::ios_base::~ios_base(local_2220);
      cmGeneratedFileStream::~cmGeneratedFileStream(&out);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)topLevelString._M_dataplus._M_p != &topLevelString.field_2) {
        operator_delete(topLevelString._M_dataplus._M_p,
                        topLevelString.field_2._M_allocated_capacity + 1);
      }
      iVar11 = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)md5filename._M_dataplus._M_p != &md5filename.field_2) {
      operator_delete(md5filename._M_dataplus._M_p,
                      CONCAT71(md5filename.field_2._M_allocated_capacity._1_7_,
                               md5filename.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)
         &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&out,"CPACK_TOPLEVEL_DIRECTORY","");
    pcVar12 = cmCPackGenerator::GetOption(&local_23c8->super_cmCPackGenerator,(string *)&out);
    std::__cxx11::string::string((string *)&md5filename,pcVar12,(allocator *)&dirName);
    if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
        (_func_int **)
        &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ +
                      1);
    }
    std::__cxx11::string::append((char *)&md5filename);
    cmGeneratedFileStream::cmGeneratedFileStream(&out,md5filename._M_dataplus._M_p,false);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"# Run command: ",0xf);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&out,cmd._M_dataplus._M_p,cmd._M_string_length);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    poVar15 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"# Working directory: ",0x15);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,(local_23c8->super_cmCPackGenerator).toplevel._M_dataplus._M_p,
                         (local_23c8->super_cmCPackGenerator).toplevel._M_string_length);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    poVar15 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"# Output:",9);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    poVar15 = (ostream *)std::ostream::flush();
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,output._M_dataplus._M_p,output._M_string_length);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dirName,"Problem running tar command: ",0x1d);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&dirName,cmd._M_dataplus._M_p,cmd._M_string_length);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    poVar15 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"Please check ",0xd);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,md5filename._M_dataplus._M_p,md5filename._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," for errors",0xb);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
    pcVar2 = (local_23c8->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    _Var26 = topLevelString._M_dataplus;
    sVar16 = strlen(topLevelString._M_dataplus._M_p);
    cmCPackLog::Log(pcVar2,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x1e3,_Var26._M_p,sVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)topLevelString._M_dataplus._M_p != &topLevelString.field_2) {
      operator_delete(topLevelString._M_dataplus._M_p,
                      topLevelString.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
    std::ios_base::~ios_base(local_2220);
    cmGeneratedFileStream::~cmGeneratedFileStream(&out);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)md5filename._M_dataplus._M_p != &md5filename.field_2) {
      operator_delete(md5filename._M_dataplus._M_p,
                      CONCAT71(md5filename.field_2._M_allocated_capacity._1_7_,
                               md5filename.field_2._M_local_buf[0]) + 1);
    }
    iVar11 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)output._M_dataplus._M_p != &output.field_2) {
    operator_delete(output._M_dataplus._M_p,
                    CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                             output.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&installDirs._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)compression_suffix._M_dataplus._M_p != &compression_suffix.field_2) {
    operator_delete(compression_suffix._M_dataplus._M_p,
                    CONCAT71(compression_suffix.field_2._M_allocated_capacity._1_7_,
                             compression_suffix.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)compression_modifier._M_dataplus._M_p != &compression_modifier.field_2) {
    operator_delete(compression_modifier._M_dataplus._M_p,
                    compression_modifier.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmake_tar._M_dataplus._M_p != &cmake_tar.field_2) {
    operator_delete(cmake_tar._M_dataplus._M_p,cmake_tar.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmd._M_dataplus._M_p != &cmd.field_2) {
    operator_delete(cmd._M_dataplus._M_p,cmd.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)debian_pkg_name._M_dataplus._M_p != &debian_pkg_name.field_2) {
    operator_delete(debian_pkg_name._M_dataplus._M_p,
                    debian_pkg_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ctlfilename._M_dataplus._M_p != &ctlfilename.field_2) {
    operator_delete(ctlfilename._M_dataplus._M_p,
                    CONCAT71(ctlfilename.field_2._M_allocated_capacity._1_7_,
                             ctlfilename.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dbfilename._M_dataplus._M_p != &dbfilename.field_2) {
    operator_delete(dbfilename._M_dataplus._M_p,
                    CONCAT71(dbfilename.field_2._M_allocated_capacity._1_7_,
                             dbfilename.field_2._M_local_buf[0]) + 1);
  }
  return iVar11;
}

Assistant:

int cmCPackDebGenerator::createDeb()
{
  // debian-binary file
  std::string dbfilename;
    dbfilename += this->GetOption("GEN_WDIR");
  dbfilename += "/debian-binary";
    { // the scope is needed for cmGeneratedFileStream
    cmGeneratedFileStream out(dbfilename.c_str());
    out << "2.0";
    out << std::endl; // required for valid debian package
    }

  // control file
  std::string ctlfilename;
    ctlfilename = this->GetOption("GEN_WDIR");
  ctlfilename += "/control";

  // debian policy enforce lower case for package name
  // mandatory entries:
  std::string debian_pkg_name = cmsys::SystemTools::LowerCase(
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_NAME") );
  const char* debian_pkg_version =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_VERSION");
  const char* debian_pkg_section =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SECTION");
  const char* debian_pkg_priority =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PRIORITY");
  const char* debian_pkg_arch =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE");
  const char* maintainer =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER");
  const char* desc =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION");

  // optional entries
  const char* debian_pkg_dep =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DEPENDS");
  const char* debian_pkg_rec =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS");
  const char* debian_pkg_sug =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS");
  const char* debian_pkg_url =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE");
  const char* debian_pkg_predep =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS");
  const char* debian_pkg_enhances =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ENHANCES");
  const char* debian_pkg_breaks =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_BREAKS");
  const char* debian_pkg_conflicts =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS");
  const char* debian_pkg_provides =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PROVIDES");
  const char* debian_pkg_replaces =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_REPLACES");

    { // the scope is needed for cmGeneratedFileStream
    cmGeneratedFileStream out(ctlfilename.c_str());
    out << "Package: " << debian_pkg_name << "\n";
    out << "Version: " << debian_pkg_version << "\n";
    out << "Section: " << debian_pkg_section << "\n";
    out << "Priority: " << debian_pkg_priority << "\n";
    out << "Architecture: " << debian_pkg_arch << "\n";
    if(debian_pkg_dep && *debian_pkg_dep)
      {
      out << "Depends: " << debian_pkg_dep << "\n";
      }
    if(debian_pkg_rec && *debian_pkg_rec)
      {
      out << "Recommends: " << debian_pkg_rec << "\n";
      }
    if(debian_pkg_sug && *debian_pkg_sug)
      {
      out << "Suggests: " << debian_pkg_sug << "\n";
      }
    if(debian_pkg_url && *debian_pkg_url)
      {
      out << "Homepage: " << debian_pkg_url << "\n";
      }
    if (debian_pkg_predep && *debian_pkg_predep)
      {
      out << "Pre-Depends: " << debian_pkg_predep << "\n";
      }
    if (debian_pkg_enhances && *debian_pkg_enhances)
      {
      out << "Enhances: " << debian_pkg_enhances << "\n";
      }
    if (debian_pkg_breaks && *debian_pkg_breaks)
      {
      out << "Breaks: " << debian_pkg_breaks << "\n";
      }
    if (debian_pkg_conflicts && *debian_pkg_conflicts)
      {
      out << "Conflicts: " << debian_pkg_conflicts << "\n";
      }
    if (debian_pkg_provides && *debian_pkg_provides)
      {
      out << "Provides: " << debian_pkg_provides << "\n";
      }
    if (debian_pkg_replaces && *debian_pkg_replaces)
      {
      out << "Replaces: " << debian_pkg_replaces << "\n";
      }
    unsigned long totalSize = 0;
    {
      std::string dirName = this->GetOption("CPACK_TEMPORARY_DIRECTORY");
      dirName += '/';
        for (std::vector<std::string>::const_iterator fileIt =
              packageFiles.begin();
              fileIt != packageFiles.end(); ++ fileIt )
        {
        totalSize += cmSystemTools::FileLength(*fileIt);
        }
    }
    out << "Installed-Size: " << (totalSize + 1023) / 1024 << "\n";
    out << "Maintainer: " << maintainer << "\n";
    out << "Description: " << desc << "\n";
    out << std::endl;
    }

  std::string cmd(this->GetOption("GEN_CPACK_DEBIAN_FAKEROOT_EXECUTABLE"));

  const char* debian_compression_type =
      this->GetOption("GEN_CPACK_DEBIAN_COMPRESSION_TYPE");
  if(!debian_compression_type)
    {
    debian_compression_type = "gzip";
    }

  std::string cmake_tar = " ", compression_modifier = "a", compression_suffix;
  if(!strcmp(debian_compression_type, "lzma")) {
      compression_suffix = ".lzma";
  } else if(!strcmp(debian_compression_type, "xz")) {
      compression_suffix = ".xz";
  } else if(!strcmp(debian_compression_type, "bzip2")) {
      compression_suffix = ".bz2";
      compression_modifier = "j";
      cmake_tar += "\"" + cmSystemTools::GetCMakeCommand() + "\" -E ";
  } else if(!strcmp(debian_compression_type, "gzip")) {
      compression_suffix = ".gz";
      compression_modifier = "z";
      cmake_tar += "\"" + cmSystemTools::GetCMakeCommand() + "\" -E ";
  } else if(!strcmp(debian_compression_type, "none")) {
      compression_suffix = "";
      compression_modifier = "";
      cmake_tar += "\"" + cmSystemTools::GetCMakeCommand() + "\" -E ";
  } else {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Error unrecognized compression type: "
                    << debian_compression_type << std::endl);
  }

  cmd += cmake_tar + "tar c" + compression_modifier + "f data.tar"
      + compression_suffix;

  // now add all directories which have to be compressed
  // collect all top level install dirs for that
  // e.g. /opt/bin/foo, /usr/bin/bar and /usr/bin/baz would give /usr and /opt
    size_t topLevelLength = std::string(this->GetOption("GEN_WDIR")).length();
    cmCPackLogger(cmCPackLog::LOG_DEBUG, "WDIR: \""
          << this->GetOption("GEN_WDIR")
          << "\", length = " << topLevelLength
          << std::endl);
  std::set<std::string> installDirs;
    for (std::vector<std::string>::const_iterator fileIt =
        packageFiles.begin();
        fileIt != packageFiles.end(); ++ fileIt )
    {
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "FILEIT: \"" << *fileIt << "\""
          << std::endl);
    std::string::size_type slashPos = fileIt->find('/', topLevelLength+1);
    std::string relativeDir = fileIt->substr(topLevelLength,
                                             slashPos - topLevelLength);
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "RELATIVEDIR: \"" << relativeDir
      << "\"" << std::endl);
    if (installDirs.find(relativeDir) == installDirs.end())
      {
      installDirs.insert(relativeDir);
      cmd += " .";
      cmd += relativeDir;
      }
    }

  std::string output;
    int retval = -1;
  int res = cmSystemTools::RunSingleCommand(cmd.c_str(), &output, &output,
      &retval, this->GetOption("GEN_WDIR"), this->GeneratorVerbose, 0);

    if ( !res || retval )
    {
    std::string tmpFile = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    tmpFile += "/Deb.log";
    cmGeneratedFileStream ofs(tmpFile.c_str());
    ofs << "# Run command: " << cmd << std::endl
      << "# Working directory: " << toplevel << std::endl
      << "# Output:" << std::endl
      << output << std::endl;
    cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem running tar command: "
      << cmd << std::endl
      << "Please check " << tmpFile << " for errors" << std::endl);
    return 0;
    }

  std::string md5filename;
    md5filename = this->GetOption("GEN_WDIR");
  md5filename += "/md5sums";

    { // the scope is needed for cmGeneratedFileStream
    cmGeneratedFileStream out(md5filename.c_str());
    std::vector<std::string>::const_iterator fileIt;
//       std::string topLevelWithTrailingSlash = toplevel;
    std::string topLevelWithTrailingSlash =
        this->GetOption("CPACK_TEMPORARY_DIRECTORY");
    topLevelWithTrailingSlash += '/';
      for ( fileIt = packageFiles.begin();
            fileIt != packageFiles.end(); ++ fileIt )
      {
      cmd = "\"";
      cmd += cmSystemTools::GetCMakeCommand();
      cmd += "\" -E md5sum \"";
      cmd += *fileIt;
      cmd += "\"";
      //std::string output;
      //int retVal = -1;
      res = cmSystemTools::RunSingleCommand(cmd.c_str(), &output, &output,
          &retval, toplevel.c_str(), this->GeneratorVerbose, 0);
      if ( !res || retval )
        {
        cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem running cmake -E md5sum "
                      << cmd << std::endl);
        }
      // debian md5sums entries are like this:
      // 014f3604694729f3bf19263bac599765  usr/bin/ccmake
      // thus strip the full path (with the trailing slash)
      cmSystemTools::ReplaceString(output,
                                   topLevelWithTrailingSlash.c_str(), "");
      out << output;
      }
    // each line contains a eol.
    // Do not end the md5sum file with yet another (invalid)
    }

    // set md5sum file permissins to RW-R--R-- so that deb lintian doesn't warn
    // about it
    cmSystemTools::SetPermissions(md5filename.c_str(),
        S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH);

    cmd = this->GetOption("GEN_CPACK_DEBIAN_FAKEROOT_EXECUTABLE");
    cmd += cmake_tar + "tar czf control.tar.gz ./control ./md5sums";
    const char* controlExtra =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA");
  if( controlExtra )
    {
    std::vector<std::string> controlExtraList;
    cmSystemTools::ExpandListArgument(controlExtra, controlExtraList);
    for(std::vector<std::string>::iterator i =
          controlExtraList.begin(); i != controlExtraList.end(); ++i)
      {
      std::string filenamename =
        cmsys::SystemTools::GetFilenameName(*i);
      std::string localcopy = this->GetOption("GEN_WDIR");
      localcopy += "/";
      localcopy += filenamename;
      // if we can copy the file, it means it does exist, let's add it:
      if( cmsys::SystemTools::CopyFileIfDifferent(
            *i, localcopy) )
        {
        // debian is picky and need relative to ./ path in the tar.*
        cmd += " ./";
        cmd += filenamename;
        }
      }
    }
  res = cmSystemTools::RunSingleCommand(cmd.c_str(), &output, &output,
      &retval, this->GetOption("GEN_WDIR"), this->GeneratorVerbose, 0);

    if ( !res || retval )
    {
    std::string tmpFile = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    tmpFile += "/Deb.log";
    cmGeneratedFileStream ofs(tmpFile.c_str());
    ofs << "# Run command: " << cmd << std::endl
      << "# Working directory: " << toplevel << std::endl
      << "# Output:" << std::endl
      << output << std::endl;
    cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem running tar command: "
      << cmd << std::endl
      << "Please check " << tmpFile << " for errors" << std::endl);
    return 0;
    }

  // ar -r your-package-name.deb debian-binary control.tar.* data.tar.*
  // since debian packages require BSD ar (most Linux distros and even
  // FreeBSD and NetBSD ship GNU ar) we use a copy of OpenBSD ar here.
  std::vector<std::string> arFiles;
    std::string topLevelString = this->GetOption("GEN_WDIR");
  topLevelString += "/";
  arFiles.push_back(topLevelString + "debian-binary");
  arFiles.push_back(topLevelString + "control.tar.gz");
  arFiles.push_back(topLevelString + "data.tar" + compression_suffix);
    std::string outputFileName = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    outputFileName += "/";
    outputFileName += this->GetOption("CPACK_OUTPUT_FILE_NAME");
    res = ar_append(outputFileName.c_str(), arFiles);
  if ( res!=0 )
    {
    std::string tmpFile = this->GetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME");
    tmpFile += "/Deb.log";
    cmGeneratedFileStream ofs(tmpFile.c_str());
    ofs << "# Problem creating archive using: " << res << std::endl;
    return 0;
    }
  return 1;
}